

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

int __thiscall
FOptionMenuFieldBase::Draw
          (FOptionMenuFieldBase *this,FOptionMenuDescriptor *param_1,int y,int indent,bool selected)

{
  FBaseCVar *pFVar1;
  EColorRange normalcolor;
  FFont *font;
  byte bVar2;
  int iVar3;
  EColorRange *pEVar4;
  undefined8 uVar5;
  FString local_40;
  DFrameBuffer *local_38;
  
  pFVar1 = this->mGrayCheck;
  if (pFVar1 == (FBaseCVar *)0x0) {
    bVar2 = 0;
  }
  else {
    iVar3 = (*pFVar1->_vptr_FBaseCVar[4])(pFVar1,0);
    bVar2 = (byte)iVar3 ^ 1;
  }
  pEVar4 = &OptionSettings.mFontColor;
  if (selected) {
    pEVar4 = &OptionSettings.mFontColorSelection;
  }
  FOptionMenuItem::drawLabel(&this->super_FOptionMenuItem,indent,y,*pEVar4,(bool)(bVar2 & 1));
  font = SmallFont;
  normalcolor = OptionSettings.mFontColorValue;
  uVar5 = 0x60300000;
  if ((bVar2 & 1) == 0) {
    uVar5 = 0;
  }
  local_38 = screen;
  iVar3 = CleanXfac_1 * 0xe;
  (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(&local_40,this);
  DCanvas::DrawText((DCanvas *)local_38,font,normalcolor,iVar3 + indent,y,local_40.Chars,0x40001394,
                    1,0x400013aa,uVar5,0);
  FString::~FString(&local_40);
  return indent;
}

Assistant:

int Draw ( FOptionMenuDescriptor*, int y, int indent, bool selected )
	{
		bool grayed = mGrayCheck != NULL && !( mGrayCheck->GetGenericRep( CVAR_Bool ).Bool );
		drawLabel( indent, y, selected ? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, grayed );
		int overlay = grayed? MAKEARGB( 96, 48, 0, 0 ) : 0;

		screen->DrawText( SmallFont, OptionSettings.mFontColorValue, indent + CURSORSPACE, y,
			Represent().GetChars(), DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE );
		return indent;
	}